

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3BackupUpdate(sqlite3_backup *pBackup,Pgno iPage,u8 *aData)

{
  sqlite3_mutex *psVar1;
  int iVar2;
  sqlite3_backup *p;
  
  if (pBackup != (sqlite3_backup *)0x0) {
    do {
      if ((((uint)pBackup->rc < 7) && ((0x61U >> (pBackup->rc & 0x1fU) & 1) != 0)) &&
         (iPage < pBackup->iNext)) {
        psVar1 = pBackup->pDestDb->mutex;
        if (psVar1 != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexEnter)(psVar1);
        }
        iVar2 = backupOnePage(pBackup,iPage,aData,1);
        psVar1 = pBackup->pDestDb->mutex;
        if (psVar1 != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(psVar1);
        }
        if (iVar2 != 0) {
          pBackup->rc = iVar2;
        }
      }
      pBackup = pBackup->pNext;
    } while (pBackup != (sqlite3_backup *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BackupUpdate(sqlite3_backup *pBackup, Pgno iPage, const u8 *aData){
  sqlite3_backup *p;                   /* Iterator variable */
  for(p=pBackup; p; p=p->pNext){
    assert( sqlite3_mutex_held(p->pSrc->pBt->mutex) );
    if( !isFatalError(p->rc) && iPage<p->iNext ){
      /* The backup process p has already copied page iPage. But now it
      ** has been modified by a transaction on the source pager. Copy
      ** the new data into the backup.
      */
      int rc;
      assert( p->pDestDb );
      sqlite3_mutex_enter(p->pDestDb->mutex);
      rc = backupOnePage(p, iPage, aData, 1);
      sqlite3_mutex_leave(p->pDestDb->mutex);
      assert( rc!=SQLITE_BUSY && rc!=SQLITE_LOCKED );
      if( rc!=SQLITE_OK ){
        p->rc = rc;
      }
    }
  }
}